

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

void Gia_ManDomTest(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *vSupp;
  Vec_Wec_t *__ptr;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar3 = (int *)malloc(400);
  vSupp->pArray = piVar3;
  __ptr = Gia_ManCreateSupps(p,1);
  iVar1 = p->nObjs;
  piVar3 = (int *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  piVar3[1] = 0;
  *piVar3 = iVar6;
  if (iVar6 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = calloc((long)iVar6,0x10);
  }
  *(void **)(piVar3 + 2) = pvVar4;
  piVar3[1] = iVar1;
  Gia_ManCreateRefs(p);
  Gia_ManComputeDoms(p);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      iVar6 = pVVar5->pArray[lVar8];
      if ((long)iVar6 < 0) goto LAB_00597716;
      if (p->nObjs <= iVar6) goto LAB_00597716;
      pGVar11 = p->pObjs;
      if (pGVar11 == (Gia_Obj_t *)0x0) break;
      if (p->vDoms->nSize <= iVar6) {
LAB_00597735:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = p->vDoms->pArray[iVar6];
      uVar9 = (ulong)uVar10;
      if (uVar9 != 0xffffffff) {
        if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) goto LAB_00597716;
        if ((~*(uint *)(pGVar11 + uVar9) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar11 + uVar9))
        {
          pGVar11 = pGVar11 + uVar9;
          do {
            pGVar2 = p->pObjs;
            if ((pGVar11 < pGVar2) || (pGVar2 + p->nObjs <= pGVar11)) {
LAB_005976f7:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar10 = (int)((long)pGVar11 - (long)pGVar2 >> 2) * -0x55555555;
            if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_00597754;
            Vec_IntPush((Vec_Int_t *)((ulong)(uVar10 & 0x7fffffff) * 0x10 + (long)pvVar4),(int)lVar8
                       );
            pGVar2 = p->pObjs;
            if ((pGVar11 < pGVar2) || (pGVar2 + p->nObjs <= pGVar11)) goto LAB_005976f7;
            uVar10 = (int)((long)pGVar11 - (long)pGVar2 >> 2) * -0x55555555;
            if (((int)uVar10 < 0) || (p->vDoms->nSize <= (int)uVar10)) goto LAB_00597735;
            iVar6 = p->vDoms->pArray[uVar10 & 0x7fffffff];
            lVar7 = (long)iVar6;
            if ((lVar7 < 0) || (p->nObjs <= iVar6)) goto LAB_00597716;
          } while ((-1 < (int)(uint)*(undefined8 *)(pGVar2 + lVar7)) &&
                  (pGVar11 = pGVar2 + lVar7,
                  ((uint)*(undefined8 *)(pGVar2 + lVar7) & 0x1fffffff) != 0x1fffffff));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  if (0 < p->nObjs) {
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar10 = *(uint *)(p->pObjs + lVar8);
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        if ((__ptr->nSize <= lVar8) || (piVar3[1] <= lVar8)) {
LAB_00597754:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar10 = __ptr->pArray[lVar8].nSize;
        if (uVar10 == *(uint *)(*(long *)(piVar3 + 2) + 4 + lVar8 * 0x10)) {
          if (0 < (int)uVar10) {
            uVar9 = 0;
            do {
              if (__ptr->pArray[lVar8].pArray[uVar9] !=
                  *(int *)(*(long *)(*(long *)(piVar3 + 2) + lVar8 * 0x10 + 8) + uVar9 * 4))
              goto LAB_00597508;
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
          Vec_IntPush(p_00,(int)lVar8);
        }
      }
LAB_00597508:
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  iVar1 = __ptr->nCap;
  if (0 < (long)iVar1) {
    pVVar5 = __ptr->pArray;
    lVar8 = 0;
    do {
      pvVar4 = *(void **)((long)&pVVar5->pArray + lVar8);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pVVar5->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar8);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  iVar1 = *piVar3;
  if (0 < (long)iVar1) {
    lVar8 = *(long *)(piVar3 + 2);
    lVar7 = 0;
    do {
      pvVar4 = *(void **)(lVar8 + 8 + lVar7);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)(lVar8 + 8 + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar7);
  }
  if (*(void **)(piVar3 + 2) != (void *)0x0) {
    free(*(void **)(piVar3 + 2));
    piVar3[2] = 0;
    piVar3[3] = 0;
  }
  piVar3[0] = 0;
  piVar3[1] = 0;
  free(piVar3);
  iVar1 = p_00->nSize;
  lVar8 = (long)iVar1;
  if (0 < lVar8) {
    piVar3 = p_00->pArray;
    lVar7 = 0;
    do {
      iVar6 = piVar3[lVar7];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00597716;
      p->pRefs[iVar6] = p->pRefs[iVar6] + 1;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  if (0 < iVar1) {
    piVar3 = p_00->pArray;
    lVar7 = 0;
    do {
      uVar10 = piVar3[lVar7];
      if (((long)(int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) goto LAB_00597716;
      Gia_NodeMffcSizeSupp(p,p->pObjs + (int)uVar10,vSupp);
      printf("%d(%d:%d) ",(ulong)uVar10,(ulong)(uint)vSupp->nSize);
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  putchar(10);
  if (0 < iVar1) {
    piVar3 = p_00->pArray;
    lVar7 = 0;
    do {
      iVar1 = piVar3[lVar7];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00597716:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p->pRefs[iVar1] = p->pRefs[iVar1] + -1;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (int *)0x0;
  }
  free(vSupp);
  return;
}

Assistant:

void Gia_ManDomTest( Gia_Man_t * p )
{
    Vec_Int_t * vDoms = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wec_t * vSupps = Gia_ManCreateSupps( p, 1 );
    Vec_Wec_t * vDomeds = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pDom; int i, Id, nMffcSize;
    Gia_ManCreateRefs( p );
    Gia_ManComputeDoms( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        if ( Gia_ObjDom(p, pObj) == -1 )
            continue;
        for ( pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj)); Gia_ObjIsAnd(pDom); pDom = Gia_ManObj(p, Gia_ObjDom(p, pDom)) )
            Vec_IntPush( Vec_WecEntry(vDomeds, Gia_ObjId(p, pDom)), i );
    }
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEqual(Vec_WecEntry(vSupps, i), Vec_WecEntry(vDomeds, i)) )
            Vec_IntPush( vDoms, i );
    Vec_WecFree( vSupps );
    Vec_WecFree( vDomeds );

    // check MFFC sizes
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefInc( p, Gia_ManObj(p, Id) );
    Vec_IntForEachEntry( vDoms, Id, i )
    {
        nMffcSize = Gia_NodeMffcSizeSupp( p, Gia_ManObj(p, Id), vSupp );
        printf( "%d(%d:%d) ", Id, Vec_IntSize(vSupp), nMffcSize );
    }
    printf( "\n" );
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefDec( p, Gia_ManObj(p, Id) );

//    Vec_IntPrint( vDoms );
    Vec_IntFree( vDoms );
    Vec_IntFree( vSupp );
}